

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nacm.c
# Opt level: O0

LY_ERR nacm_inherit_clb(lysc_node *node,void *data,ly_bool *dfs_continue)

{
  ly_stmt lVar1;
  LY_ERR LVar2;
  lysc_ext_instance *__s;
  char *local_60;
  undefined8 *local_50;
  char *p__;
  uint64_t u;
  lysc_ext_instance *inherited;
  nacm_dfs_arg *arg;
  LY_ERR ret;
  ly_bool *dfs_continue_local;
  void *data_local;
  lysc_node *node_local;
  
  if ((node != *(lysc_node **)((long)data + 8)) && ((node->nodetype & 0x3000) == 0)) {
    p__ = (char *)0x0;
    while( true ) {
      if (node->exts == (lysc_ext_instance *)0x0) {
        local_60 = (char *)0x0;
      }
      else {
        local_60 = (char *)node->exts[-1].compiled;
      }
      if (local_60 <= p__) break;
      if (node->exts[(long)p__].def == (lysc_ext *)**data) {
        *dfs_continue = '\x01';
        return LY_SUCCESS;
      }
      p__ = p__ + 1;
    }
    if (node->exts == (lysc_ext_instance *)0x0) {
      local_50 = (undefined8 *)malloc(0x50);
      if (local_50 == (undefined8 *)0x0) goto LAB_002079d1;
      *local_50 = 1;
    }
    else {
      node->exts[-1].compiled = (void *)((long)node->exts[-1].compiled + 1);
      local_50 = (undefined8 *)
                 realloc(&node->exts[-1].compiled,(long)node->exts[-1].compiled * 0x48 + 8);
      if (local_50 == (undefined8 *)0x0) {
        node->exts[-1].compiled = (void *)((long)node->exts[-1].compiled + -1);
LAB_002079d1:
        lyplg_ext_compile_log
                  ((lysc_ctx *)0x0,*data,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                   "nacm_inherit_clb");
        return LY_EMEM;
      }
    }
    node->exts = (lysc_ext_instance *)(local_50 + 1);
    __s = node->exts + (long)node->exts[-1].compiled + -1;
    memset(__s,0,0x48);
    __s->def = (lysc_ext *)**data;
    __s->parent = node;
    lVar1 = lyplg_ext_nodetype2stmt(node->nodetype);
    __s->parent_stmt = lVar1;
    if ((*(long *)(*data + 8) != 0) &&
       (LVar2 = lydict_insert(node->module->ctx,*(char **)(*data + 8),0,&__s->argument),
       LVar2 != LY_SUCCESS)) {
      return LVar2;
    }
    __s->compiled = *(void **)(*data + 0x40);
  }
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
nacm_inherit_clb(struct lysc_node *node, void *data, ly_bool *dfs_continue)
{
    LY_ERR ret;
    struct nacm_dfs_arg *arg = data;
    struct lysc_ext_instance *inherited;
    LY_ARRAY_COUNT_TYPE u;

    /* ignore the parent from which we inherit and input/output nodes */
    if ((node != arg->parent) && !(node->nodetype & (LYS_INPUT | LYS_OUTPUT))) {
        /* check that the node does not have its own NACM extension instance */
        LY_ARRAY_FOR(node->exts, u) {
            if (node->exts[u].def == arg->ext->def) {
                /* the child already have its own NACM flag, so skip the subtree */
                *dfs_continue = 1;
                return LY_SUCCESS;
            }
        }

        /* duplicate this one to inherit it to the child */
        LY_ARRAY_NEW_GOTO(node->module->ctx, node->exts, inherited, ret, emem);

        inherited->def = arg->ext->def;
        inherited->parent = node;
        inherited->parent_stmt = lyplg_ext_nodetype2stmt(node->nodetype);
        if (arg->ext->argument) {
            if ((ret = lydict_insert(node->module->ctx, arg->ext->argument, 0, &inherited->argument))) {
                return ret;
            }
        }
        /* copy the pointer to the static variables */
        inherited->compiled = arg->ext->compiled;
    }

    return LY_SUCCESS;

emem:
    lyplg_ext_compile_log(NULL, arg->ext, LY_LLERR, LY_EMEM, "Memory allocation failed (%s()).", __func__);
    return ret;
}